

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue-149-entry-selection.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1371f::store_err_handler::error
          (store_err_handler *this,json_pointer *ptr,json *instance,string *message)

{
  ostream *poVar1;
  
  (this->super_basic_error_handler).error_ = true;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: \'",8);
  poVar1 = nlohmann::json_abi_v3_11_2::operator<<((ostream *)&std::cerr,ptr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' - \'",5);
  poVar1 = nlohmann::json_abi_v3_11_2::operator<<(poVar1,instance);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\': ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::
  vector<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&this->failed,ptr);
  return;
}

Assistant:

void error(const nlohmann::json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		nlohmann::json_schema::basic_error_handler::error(ptr, instance, message);
		std::cerr << "ERROR: '" << ptr << "' - '" << instance << "': " << message << "\n";
		failed.push_back(ptr);
	}